

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::calcIndicators(AbstractScrollAreaPrivate *this)

{
  bool bVar1;
  int iVar2;
  AbstractScrollAreaPrivate *this_local;
  
  bVar1 = QSize::isValid(&this->scrolledAreaSize);
  if (((bVar1) && (iVar2 = QSize::width(&this->scrolledAreaSize), iVar2 != 0)) &&
     (iVar2 = QSize::height(&this->scrolledAreaSize), iVar2 != 0)) {
    calcIndicator(this,Horizontal,this->horIndicator->minimumSize,this->horIndicator->width,
                  &this->horIndicator->needPaint,&this->horIndicator->size,&this->horIndicator->pos)
    ;
    QWidget::move((QPoint *)this->horIndicator);
    QWidget::resize(&this->horIndicator->super_QWidget,this->horIndicator->size,
                    this->horIndicator->width);
    calcIndicator(this,Vertical,this->vertIndicator->minimumSize,this->vertIndicator->width,
                  &this->vertIndicator->needPaint,&this->vertIndicator->size,
                  &this->vertIndicator->pos);
    QWidget::move((QPoint *)this->vertIndicator);
    QWidget::resize(&this->vertIndicator->super_QWidget,this->vertIndicator->width,
                    this->vertIndicator->size);
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::calcIndicators()
{
	if( scrolledAreaSize.isValid() && scrolledAreaSize.width() != 0
		&& scrolledAreaSize.height() != 0 )
	{
		calcIndicator( Qt::Horizontal, horIndicator->minimumSize,
			horIndicator->width, horIndicator->needPaint,
			horIndicator->size, horIndicator->pos );

		horIndicator->move( horIndicator->pos );
		horIndicator->resize( horIndicator->size, horIndicator->width );

		calcIndicator( Qt::Vertical, vertIndicator->minimumSize,
			vertIndicator->width, vertIndicator->needPaint,
			vertIndicator->size, vertIndicator->pos );

		vertIndicator->move( vertIndicator->pos );
		vertIndicator->resize( vertIndicator->width, vertIndicator->size );
	}
}